

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O2

void __thiscall
ValidatorTest_MissingCatchTag_Test::TestBody(ValidatorTest_MissingCatchTag_Test *this)

{
  __node_base_ptr *this_00;
  __node_base_ptr *this_01;
  byte bVar1;
  Try *pTVar2;
  Const *pCVar3;
  char *in_R9;
  undefined1 local_640 [8];
  Module module;
  Function function;
  AssertionResult gtest_ar_;
  string_view local_48;
  Message local_38;
  AssertHelper local_30;
  undefined1 local_21 [8];
  WasmValidator validator;
  
  ::wasm::Module::Module((Module *)local_640);
  module.debugInfoSourcesContent.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ =
       (byte)module.debugInfoSourcesContent.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage | 0x40;
  this_00 = &module.typeIndices._M_h._M_single_bucket;
  pTVar2 = MixedArena::alloc<wasm::Try>((MixedArena *)this_00);
  ::wasm::Name::Name((Name *)&module.tagsMap._M_h._M_single_bucket,"tst1");
  (pTVar2->name).super_IString.str._M_len =
       CONCAT44(module.tagsMap._M_h._M_single_bucket._4_4_,
                module.tagsMap._M_h._M_single_bucket._0_4_);
  (pTVar2->name).super_IString.str._M_str =
       (char *)function.super_Importable.super_Named.name.super_IString.str._M_len;
  pCVar3 = MixedArena::alloc<wasm::Const>((MixedArena *)this_00);
  module.tagsMap._M_h._M_single_bucket._0_4_ = 1;
  function.super_Importable.super_Named.name.super_IString.str._M_str = (char *)0x2;
  ::wasm::Literal::operator=(&pCVar3->value,(Literal *)&module.tagsMap._M_h._M_single_bucket);
  ::wasm::Literal::~Literal((Literal *)&module.tagsMap._M_h._M_single_bucket);
  pTVar2->body = (Expression *)pCVar3;
  ::wasm::Name::Name((Name *)&local_48,"foo");
  ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::push_back
            (&(pTVar2->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
             (Name)local_48);
  pCVar3 = MixedArena::alloc<wasm::Const>((MixedArena *)this_00);
  module.tagsMap._M_h._M_single_bucket._0_4_ = 2;
  function.super_Importable.super_Named.name.super_IString.str._M_str = (char *)0x2;
  ::wasm::Literal::operator=(&pCVar3->value,(Literal *)&module.tagsMap._M_h._M_single_bucket);
  ::wasm::Literal::~Literal((Literal *)&module.tagsMap._M_h._M_single_bucket);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&(pTVar2->catchBodies).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)pCVar3);
  this_01 = &module.tagsMap._M_h._M_single_bucket;
  memset(this_01,0,0x1d8);
  ::wasm::Function::Function((Function *)this_01);
  function.vars.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pTVar2;
  bVar1 = ::wasm::WasmValidator::validate
                    ((Function *)local_21,(Module *)&module.tagsMap._M_h._M_single_bucket,
                     (uint)local_640);
  function.noFullInline = (bool)(bVar1 ^ 1);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (bVar1 != 0) {
    testing::Message::Message(&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_.message_,(internal *)&function.noFullInline,
               (AssertionResult *)"validator.validate(&function, module, flags)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/validator.cpp"
               ,0x31,(char *)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
    testing::internal::AssertHelper::operator=(&local_30,&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    std::__cxx11::string::~string((string *)&gtest_ar_.message_);
    if (local_38.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_38.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  ::wasm::Function::~Function((Function *)&module.tagsMap._M_h._M_single_bucket);
  ::wasm::Module::~Module((Module *)local_640);
  return;
}

Assistant:

TEST(ValidatorTest, MissingCatchTag) {
  WasmValidator validator;
  Module module;
  module.features.enable(FeatureSet::ExceptionHandling);
  auto tryExp = module.allocator.alloc<Try>();
  tryExp->name = "tst1";
  auto bodyExp = module.allocator.alloc<Const>();
  bodyExp->value = Literal(1);
  tryExp->body = bodyExp;
  tryExp->catchTags.push_back(wasm::Name("foo"));
  auto catchBodyExp = module.allocator.alloc<Const>();
  catchBodyExp->value = Literal(2);
  tryExp->catchBodies.push_back(catchBodyExp);
  Function function = Function();
  function.body = tryExp;
  WasmValidator::Flags flags =
    WasmValidator::FlagValues::Globally | WasmValidator::FlagValues::Quiet;
  EXPECT_FALSE(validator.validate(&function, module, flags));
}